

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O2

void __thiscall NLReaderTest_ReadNotExpr_Test::TestBody(NLReaderTest_ReadNotExpr_Test *this)

{
  char *message;
  allocator<char> local_9a;
  allocator<char> local_99;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"v0 <= 0; v1 <= 0; v2 <= 0; v3 <= 0; v4 <= 0; ",&local_99);
  std::operator+(&local_68,&local_88,"l0: not l0;");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"L0\no34\nn0\n",&local_9a);
  ReadNL(&local_28,&local_48,true);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,
             "std::string(\"v0 <= 0; v1 <= 0; v2 <= 0; v3 <= 0; v4 <= 0; \") + \"l0: not l0;\"",
             "ReadNL(\"L0\\no34\\nn0\\n\")",&local_68,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0x4c8,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(NLReaderTest, ReadNotExpr) {
  EXPECT_READ("l0: not l0;", "L0\no34\nn0\n");
}